

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

int doMain(int startArgumentIndex,int argc,char **argv)

{
  char *cstring;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  sysbvm_context_t *psVar5;
  int iVar6;
  sysbvm_tuple_t sVar7;
  sysbvm_tuple_t sVar8;
  size_t sVar9;
  sysbvm_tuple_t element;
  ulong local_d0;
  size_t i_3;
  size_t inlineScriptToRunCount;
  size_t i_2;
  size_t inputFileSize_1;
  size_t i_1;
  size_t inputFileSize;
  char *arg;
  int i;
  _Bool isParsingRemainingArgs;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_72_9_3b666fec gcFrame;
  _Bool printStats;
  _Bool parseOnly;
  _Bool scanOnly;
  char **argv_local;
  int argc_local;
  int startArgumentIndex_local;
  
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  memset(&gcFrameRecord.roots,0,0x48);
  memset(&i,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_COUNT;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&i);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_orderedCollection_create(context);
  sVar7 = sysbvm_orderedCollection_create(context);
  gcFrame.inlineScriptToRun = sysbvm_orderedCollection_create(context);
  bVar1 = false;
  arg._0_4_ = startArgumentIndex;
  do {
    psVar5 = context;
    if (argc <= (int)arg) {
      if ((bVar2) || (bVar3)) {
        sVar7 = sysbvm_orderedCollection_create(context);
        sVar9 = sysbvm_orderedCollection_getSize((sysbvm_tuple_t)gcFrameRecord.roots);
        for (inputFileSize_1 = 0; inputFileSize_1 < sVar9; inputFileSize_1 = inputFileSize_1 + 1) {
          sVar8 = sysbvm_orderedCollection_at((sysbvm_tuple_t)gcFrameRecord.roots,inputFileSize_1);
          sVar8 = sysbvm_filesystem_absolute(context,sVar8);
          sVar8 = sysbvm_interpreter_loadSourceCodeWithSolvedPath(context,sVar8);
          element = sysbvm_scanner_scan(context,sVar8);
          if (bVar2) {
            sysbvm_orderedCollection_add(context,sVar7,element);
          }
          if (bVar3) {
            sVar8 = sysbvm_parser_parseTokens(context,sVar8,element);
            sysbvm_orderedCollection_add(context,sVar7,sVar8);
          }
        }
      }
      else {
        sVar9 = sysbvm_orderedCollection_getSize((sysbvm_tuple_t)gcFrameRecord.roots);
        for (inlineScriptToRunCount = 0; psVar5 = context, inlineScriptToRunCount < sVar9;
            inlineScriptToRunCount = inlineScriptToRunCount + 1) {
          sVar7 = sysbvm_orderedCollection_at
                            ((sysbvm_tuple_t)gcFrameRecord.roots,inlineScriptToRunCount);
          sVar7 = sysbvm_filesystem_absolute(context,sVar7);
          sysbvm_interpreter_loadSourceNamedWithSolvedPath(context,sVar7);
        }
        sVar7 = sysbvm_analysisQueue_getDefault(context);
        sysbvm_analysisQueue_waitPendingAnalysis(psVar5,sVar7);
        sVar9 = sysbvm_orderedCollection_getSize(gcFrame.inlineScriptToRun);
        for (local_d0 = 0; psVar5 = context, local_d0 < sVar9; local_d0 = local_d0 + 1) {
          gcFrame.inlineScriptToRun =
               sysbvm_orderedCollection_at(gcFrame.inlineScriptToRun,local_d0);
          psVar5 = context;
          sVar7 = sysbvm_string_createWithCString(context,"commandLine");
          sVar8 = sysbvm_symbol_internWithCString(context,"sysmel");
          sysbvm_interpreter_evaluateScript(psVar5,gcFrame.inlineScriptToRun,sVar7,sVar8);
        }
        sVar7 = sysbvm_analysisQueue_getDefault(context);
        sysbvm_analysisQueue_waitPendingAnalysis(psVar5,sVar7);
      }
      if (bVar4) {
        sysbvm_context_printMemoryUsageStats(context);
      }
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&i);
      return 0;
    }
    cstring = argv[(int)arg];
    if (bVar1) {
      sVar8 = sysbvm_string_createWithCString(context,cstring);
      sysbvm_orderedCollection_add(psVar5,sVar7,sVar8);
    }
    else if (*cstring == '-') {
      iVar6 = strcmp(cstring,"-help");
      if (iVar6 == 0) {
        printHelp();
        return 0;
      }
      iVar6 = strcmp(cstring,"-version");
      if (iVar6 == 0) {
        printVersion();
        return 0;
      }
      iVar6 = strcmp(cstring,"-save-image");
      if (iVar6 == 0) {
        arg._0_4_ = (int)arg + 1;
        destinationImageFilename = argv[(int)arg];
      }
      else {
        iVar6 = strcmp(cstring,"-scan-only");
        if (iVar6 == 0) {
          bVar2 = true;
        }
        else {
          iVar6 = strcmp(cstring,"-parse-only");
          if (iVar6 == 0) {
            bVar3 = true;
          }
          else {
            iVar6 = strcmp(cstring,"-print-stats");
            if (iVar6 == 0) {
              bVar4 = true;
            }
            else {
              iVar6 = strcmp(cstring,"-e");
              if (iVar6 == 0) {
                arg._0_4_ = (int)arg + 1;
                sVar8 = sysbvm_string_createWithCString(context,argv[(int)arg]);
                sysbvm_orderedCollection_add(context,gcFrame.inlineScriptToRun,sVar8);
              }
              else {
                iVar6 = strcmp(cstring,"--");
                if (iVar6 == 0) {
                  bVar1 = true;
                }
                else {
                  iVar6 = strcmp(argv[(int)arg],"-m32");
                  if (((iVar6 != 0) && (iVar6 = strcmp(argv[(int)arg],"-m64"), iVar6 != 0)) &&
                     (iVar6 = strcmp(argv[(int)arg],"-nojit"), iVar6 != 0)) {
                    strcmp(argv[(int)arg],"-nogc");
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      sVar8 = sysbvm_string_createWithCString(context,cstring);
      sysbvm_orderedCollection_add(context,(sysbvm_tuple_t)gcFrameRecord.roots,sVar8);
    }
    arg._0_4_ = (int)arg + 1;
  } while( true );
}

Assistant:

int doMain(int startArgumentIndex, int argc, const char *argv[])
{
    bool scanOnly = false;
    bool parseOnly = false;
    bool printStats = false;
    struct {
        sysbvm_tuple_t filesToProcess;
        sysbvm_tuple_t remainingArgs;
        sysbvm_tuple_t inputFileName;
        sysbvm_tuple_t inlineScriptToRun;
        sysbvm_tuple_t inlineScriptsToRun;
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t scanResult;
        sysbvm_tuple_t parseResult;
        sysbvm_tuple_t parseScanResults;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    // Parse the command line.
    gcFrame.filesToProcess = sysbvm_orderedCollection_create(context);
    gcFrame.remainingArgs = sysbvm_orderedCollection_create(context);
    gcFrame.inlineScriptsToRun = sysbvm_orderedCollection_create(context);
    bool isParsingRemainingArgs = false;
    for(int i = startArgumentIndex; i < argc; ++i)
    {
        const char *arg = argv[i];
        if(isParsingRemainingArgs)
        {
            sysbvm_orderedCollection_add(context, gcFrame.remainingArgs, sysbvm_string_createWithCString(context, arg));
            continue;
        }
        
        if(*arg == '-')
        {
            if(!strcmp(arg, "-help"))
            {
                printHelp();
                return 0;
            }
            else if(!strcmp(arg, "-version"))
            {
                printVersion();
                return 0;
            }
            else if(!strcmp(arg, "-save-image"))
            {
                arg = argv[++i];
                destinationImageFilename = arg;
            }
            else if(!strcmp(arg, "-scan-only"))
            {
                scanOnly = true;
            }
            else if(!strcmp(arg, "-parse-only"))
            {
                parseOnly = true;
            }
            else if(!strcmp(arg, "-print-stats"))
            {
                printStats = true;
            }
            else if(!strcmp(arg, "-e"))
            {
                arg = argv[++i];
                gcFrame.inlineScriptToRun = sysbvm_string_createWithCString(context, arg);
                sysbvm_orderedCollection_add(context, gcFrame.inlineScriptsToRun, gcFrame.inlineScriptToRun);
            }
            else if(!strcmp(arg, "--"))
            {
                isParsingRemainingArgs = true;
            }
            else if(!strcmp(argv[i], "-m32") ||
                !strcmp(argv[i], "-m64") ||
                !strcmp(argv[i], "-nojit") ||
                !strcmp(argv[i], "-nogc")
            )
            {
                // These options are parsed before the context creation.
            }
        }
        else
        {
            gcFrame.inputFileName = sysbvm_string_createWithCString(context, arg);
            sysbvm_orderedCollection_add(context, gcFrame.filesToProcess, gcFrame.inputFileName);
        }
    }

    if(scanOnly || parseOnly)
    {
        gcFrame.parseScanResults = sysbvm_orderedCollection_create(context);
        {
            size_t inputFileSize = sysbvm_orderedCollection_getSize(gcFrame.filesToProcess);
            for(size_t i = 0; i < inputFileSize; ++i)
            {
                gcFrame.inputFileName = sysbvm_orderedCollection_at(gcFrame.filesToProcess, i);
                gcFrame.inputFileName = sysbvm_filesystem_absolute(context, gcFrame.inputFileName);
                gcFrame.sourceCode = sysbvm_interpreter_loadSourceCodeWithSolvedPath(context, gcFrame.inputFileName);
                gcFrame.scanResult = sysbvm_scanner_scan(context, gcFrame.sourceCode);
                if(scanOnly)
                    sysbvm_orderedCollection_add(context, gcFrame.parseScanResults, gcFrame.scanResult);

                if(parseOnly)
                {
                    gcFrame.parseResult = sysbvm_parser_parseTokens(context, gcFrame.sourceCode, gcFrame.scanResult);
                    sysbvm_orderedCollection_add(context, gcFrame.parseScanResults, gcFrame.parseResult);
                }
            }

        }
    }
    else
    {
        {
            size_t inputFileSize = sysbvm_orderedCollection_getSize(gcFrame.filesToProcess);
            for(size_t i = 0; i < inputFileSize; ++i)
            {
                gcFrame.inputFileName = sysbvm_orderedCollection_at(gcFrame.filesToProcess, i);
                gcFrame.inputFileName = sysbvm_filesystem_absolute(context, gcFrame.inputFileName);
                sysbvm_interpreter_loadSourceNamedWithSolvedPath(context, gcFrame.inputFileName);
            }

            sysbvm_analysisQueue_waitPendingAnalysis(context, sysbvm_analysisQueue_getDefault(context));
        }

        {
            size_t inlineScriptToRunCount = sysbvm_orderedCollection_getSize(gcFrame.inlineScriptsToRun);
            for(size_t i = 0; i < inlineScriptToRunCount; ++i)
            {
                gcFrame.inlineScriptsToRun = sysbvm_orderedCollection_at(gcFrame.inlineScriptsToRun, i);
                sysbvm_interpreter_evaluateScript(context, gcFrame.inlineScriptsToRun, sysbvm_string_createWithCString(context, "commandLine"), sysbvm_symbol_internWithCString(context, "sysmel"));
            }

            sysbvm_analysisQueue_waitPendingAnalysis(context, sysbvm_analysisQueue_getDefault(context));
        }
    }

    if(printStats)
        sysbvm_context_printMemoryUsageStats(context);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return 0;
}